

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O0

int try_psk_handshake(ptls_t *tls,size_t *psk_index,int *accept_early_data,
                     st_ptls_client_hello_t *ch,ptls_iovec_t ch_trunc)

{
  ptls_iovec_t x;
  ptls_iovec_t x_00;
  ptls_iovec_t ikm;
  int iVar1;
  ptls_iovec_t *ppVar2;
  bool bVar3;
  ptls_key_exchange_algorithm_t **local_248;
  ptls_key_exchange_algorithm_t **a;
  int64_t delta;
  st_ptls_client_hello_psk_t *identity;
  undefined1 local_228 [4];
  int ret;
  uint8_t verify_data [64];
  uint8_t binder_key [64];
  uint8_t decbuf_small [256];
  uint16_t local_a0;
  uint16_t local_9e;
  uint32_t local_9c;
  uint16_t ticket_csid;
  uint16_t ticket_key_exchange_id;
  uint32_t age_add;
  uint64_t now;
  uint64_t issue_at;
  ptls_iovec_t ticket_negotiated_protocol;
  ptls_iovec_t ticket_server_name;
  ptls_iovec_t ticket_psk;
  ptls_buffer_t decbuf;
  st_ptls_client_hello_t *ch_local;
  int *accept_early_data_local;
  size_t *psk_index_local;
  ptls_t *tls_local;
  ptls_iovec_t ch_trunc_local;
  
  _ticket_csid = (*tls->ctx->get_time->cb)(tls->ctx->get_time);
  ptls_buffer_init((ptls_buffer_t *)&ticket_psk.len,binder_key + 0x38,0x100);
  *psk_index = 0;
  do {
    if ((ch->psk).identities.count <= *psk_index) {
      *psk_index = 0xffffffffffffffff;
      *accept_early_data = 0;
      tls->key_share = (ptls_key_exchange_algorithm_t *)0x0;
      identity._4_4_ = 0;
LAB_00128284:
      ptls_buffer_dispose((ptls_buffer_t *)&ticket_psk.len);
      (*ptls_clear_memory)(verify_data + 0x38,0x40);
      (*ptls_clear_memory)(local_228,0x40);
      return identity._4_4_;
    }
    ppVar2 = &(ch->psk).identities.list[*psk_index].identity;
    iVar1 = (*tls->ctx->encrypt_ticket->cb)
                      (tls->ctx->encrypt_ticket,tls,0,(ptls_buffer_t *)&ticket_psk.len,*ppVar2);
    if ((((iVar1 == 0) &&
         (iVar1 = decode_session_identifier
                            (&now,(ptls_iovec_t *)&ticket_server_name.len,&local_9c,
                             (ptls_iovec_t *)&ticket_negotiated_protocol.len,&local_9e,&local_a0,
                             (ptls_iovec_t *)&issue_at,(uint8_t *)ticket_psk.len,
                             (uint8_t *)ticket_psk.len), iVar1 == 0)) && (now <= _ticket_csid)) &&
       (_ticket_csid - now <= (ulong)tls->ctx->ticket_lifetime * 1000)) {
      *accept_early_data = 0;
      if ((ch->psk).early_data_indication != 0) {
        a = (ptls_key_exchange_algorithm_t **)
            ((_ticket_csid - now) - (ulong)(*(int *)&ppVar2[1].base - local_9c));
        if ((long)a < 0) {
          a = (ptls_key_exchange_algorithm_t **)-(long)a;
        }
        if ((long)a < 0x2711) {
          *accept_early_data = 1;
        }
      }
      if (ticket_server_name.base == (uint8_t *)0x0) {
        if (tls->server_name == (char *)0x0) goto LAB_00128028;
      }
      else if ((tls->server_name != (char *)0x0) &&
              (x_00.len = (size_t)ticket_server_name.base,
              x_00.base = (uint8_t *)ticket_negotiated_protocol.len,
              iVar1 = vec_is_string(x_00,tls->server_name), iVar1 != 0)) {
LAB_00128028:
        local_248 = tls->ctx->key_exchanges;
        while( true ) {
          bVar3 = false;
          if (*local_248 != (ptls_key_exchange_algorithm_t *)0x0) {
            bVar3 = (*local_248)->id != local_9e;
          }
          if (!bVar3) break;
          local_248 = local_248 + 1;
        }
        if (((((*local_248 != (ptls_key_exchange_algorithm_t *)0x0) &&
              (tls->key_share = *local_248, local_a0 == tls->cipher_suite->id)) &&
             ((ticket_negotiated_protocol.base == (uint8_t *)0x0 ||
              ((tls->negotiated_protocol != (char *)0x0 &&
               (x.len = (size_t)ticket_negotiated_protocol.base, x.base = (uint8_t *)issue_at,
               iVar1 = vec_is_string(x,tls->negotiated_protocol), iVar1 != 0)))))) &&
            (ticket_psk.base == (uint8_t *)(tls->key_schedule->hashes[0].algo)->digest_size)) &&
           ((ch->psk).identities.list[*psk_index].binder.len ==
            (tls->key_schedule->hashes[0].algo)->digest_size)) {
          ikm.len = (size_t)ticket_psk.base;
          ikm.base = (uint8_t *)ticket_server_name.len;
          identity._4_4_ = key_schedule_extract(tls->key_schedule,ikm);
          if ((identity._4_4_ == 0) &&
             (identity._4_4_ = derive_secret(tls->key_schedule,verify_data + 0x38,"res binder"),
             identity._4_4_ == 0)) {
            ptls__key_schedule_update_hash(tls->key_schedule,ch_trunc.base,ch_trunc.len);
            identity._4_4_ = calc_verify_data(local_228,tls->key_schedule,verify_data + 0x38);
            if (identity._4_4_ == 0) {
              iVar1 = (*ptls_mem_equal)((ch->psk).identities.list[*psk_index].binder.base,local_228,
                                        (tls->key_schedule->hashes[0].algo)->digest_size);
              if (iVar1 == 0) {
                identity._4_4_ = 0x33;
              }
              else {
                identity._4_4_ = 0;
              }
            }
          }
          goto LAB_00128284;
        }
      }
    }
    *psk_index = *psk_index + 1;
  } while( true );
}

Assistant:

static int try_psk_handshake(ptls_t *tls, size_t *psk_index, int *accept_early_data, struct st_ptls_client_hello_t *ch,
                             ptls_iovec_t ch_trunc)
{
    ptls_buffer_t decbuf;
    ptls_iovec_t ticket_psk, ticket_server_name, ticket_negotiated_protocol;
    uint64_t issue_at, now = tls->ctx->get_time->cb(tls->ctx->get_time);
    uint32_t age_add;
    uint16_t ticket_key_exchange_id, ticket_csid;
    uint8_t decbuf_small[256], binder_key[PTLS_MAX_DIGEST_SIZE], verify_data[PTLS_MAX_DIGEST_SIZE];
    int ret;

    ptls_buffer_init(&decbuf, decbuf_small, sizeof(decbuf_small));

    for (*psk_index = 0; *psk_index < ch->psk.identities.count; ++*psk_index) {
        struct st_ptls_client_hello_psk_t *identity = ch->psk.identities.list + *psk_index;
        /* decrypt and decode */
        decbuf.off = 0;
        if ((tls->ctx->encrypt_ticket->cb(tls->ctx->encrypt_ticket, tls, 0, &decbuf, identity->identity)) != 0)
            continue;
        if (decode_session_identifier(&issue_at, &ticket_psk, &age_add, &ticket_server_name, &ticket_key_exchange_id, &ticket_csid,
                                      &ticket_negotiated_protocol, decbuf.base, decbuf.base + decbuf.off) != 0)
            continue;
        /* check age */
        if (now < issue_at)
            continue;
        if (now - issue_at > (uint64_t)tls->ctx->ticket_lifetime * 1000)
            continue;
        *accept_early_data = 0;
        if (ch->psk.early_data_indication) {
            /* accept early-data if abs(diff) between the reported age and the actual age is within += 10 seconds */
            int64_t delta = (now - issue_at) - (identity->obfuscated_ticket_age - age_add);
            if (delta < 0)
                delta = -delta;
            if (delta <= PTLS_EARLY_DATA_MAX_DELAY)
                *accept_early_data = 1;
        }
        /* check server-name */
        if (ticket_server_name.len != 0) {
            if (tls->server_name == NULL)
                continue;
            if (!vec_is_string(ticket_server_name, tls->server_name))
                continue;
        } else {
            if (tls->server_name != NULL)
                continue;
        }
        { /* check key-exchange */
            ptls_key_exchange_algorithm_t **a;
            for (a = tls->ctx->key_exchanges; *a != NULL && (*a)->id != ticket_key_exchange_id; ++a)
                ;
            if (*a == NULL)
                continue;
            tls->key_share = *a;
        }
        /* check cipher-suite */
        if (ticket_csid != tls->cipher_suite->id)
            continue;
        /* check negotiated-protocol */
        if (ticket_negotiated_protocol.len != 0) {
            if (tls->negotiated_protocol == NULL)
                continue;
            if (!vec_is_string(ticket_negotiated_protocol, tls->negotiated_protocol))
                continue;
        }
        /* check the length of the decrypted psk and the PSK binder */
        if (ticket_psk.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;
        if (ch->psk.identities.list[*psk_index].binder.len != tls->key_schedule->hashes[0].algo->digest_size)
            continue;

        /* found */
        goto Found;
    }

    /* not found */
    *psk_index = SIZE_MAX;
    *accept_early_data = 0;
    tls->key_share = NULL;
    ret = 0;
    goto Exit;

Found:
    if ((ret = key_schedule_extract(tls->key_schedule, ticket_psk)) != 0)
        goto Exit;
    if ((ret = derive_secret(tls->key_schedule, binder_key, "res binder")) != 0)
        goto Exit;
    ptls__key_schedule_update_hash(tls->key_schedule, ch_trunc.base, ch_trunc.len);
    if ((ret = calc_verify_data(verify_data, tls->key_schedule, binder_key)) != 0)
        goto Exit;
    if (!ptls_mem_equal(ch->psk.identities.list[*psk_index].binder.base, verify_data,
                        tls->key_schedule->hashes[0].algo->digest_size)) {
        ret = PTLS_ALERT_DECRYPT_ERROR;
        goto Exit;
    }
    ret = 0;

Exit:
    ptls_buffer_dispose(&decbuf);
    ptls_clear_memory(binder_key, sizeof(binder_key));
    ptls_clear_memory(verify_data, sizeof(verify_data));
    return ret;
}